

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O0

ngx_int_t ngx_chain_writer(void *data,ngx_chain_t *in)

{
  long lVar1;
  ngx_chain_t *pnVar2;
  ngx_chain_t *pnVar3;
  long local_a8;
  long local_a0;
  long local_98;
  long local_80;
  long local_78;
  ngx_connection_t *c;
  ngx_chain_t *chain;
  ngx_chain_t *ln;
  ngx_chain_t *cl;
  off_t size;
  ngx_chain_writer_ctx_t *ctx;
  ngx_chain_t *in_local;
  void *data_local;
  
  lVar1 = *(long *)((long)data + 0x10);
  cl = (ngx_chain_t *)0x0;
  ctx = (ngx_chain_writer_ctx_t *)in;
  do {
    if (ctx == (ngx_chain_writer_ctx_t *)0x0) {
      if ((**(ulong **)(lVar1 + 0x50) & 0x10) != 0) {
        ngx_log_error_core(8,*(ngx_log_t **)(lVar1 + 0x50),0,"chain writer in: %p",*data);
      }
      for (ln = *data; ln != (ngx_chain_t *)0x0; ln = ln->next) {
        if ((((*(ushort *)&ln->buf->field_0x48 & 1) == 0) &&
            ((*(ushort *)&ln->buf->field_0x48 >> 1 & 1) == 0)) &&
           ((*(ushort *)&ln->buf->field_0x48 >> 2 & 1) == 0)) {
          local_a0 = ln->buf->file_last - ln->buf->file_pos;
        }
        else {
          local_a0 = (long)ln->buf->last - (long)ln->buf->pos;
        }
        if ((local_a0 == 0) &&
           ((((((*(ushort *)&ln->buf->field_0x48 >> 5 & 1) == 0 &&
               ((*(ushort *)&ln->buf->field_0x48 >> 7 & 1) == 0)) &&
              ((*(ushort *)&ln->buf->field_0x48 >> 6 & 1) == 0)) ||
             (((*(ushort *)&ln->buf->field_0x48 & 1) != 0 ||
              ((*(ushort *)&ln->buf->field_0x48 >> 1 & 1) != 0)))) ||
            (((*(ushort *)&ln->buf->field_0x48 >> 2 & 1) != 0 ||
             ((*(ushort *)&ln->buf->field_0x48 >> 4 & 1) != 0)))))) {
          if (1 < **(ulong **)(*(long *)((long)data + 0x18) + 0x48)) {
            ngx_log_error_core(2,*(ngx_log_t **)(*(long *)((long)data + 0x18) + 0x48),0,
                               "zero size buf in chain writer t:%d r:%d f:%d %p %p-%p %p %O-%O",
                               (ulong)(*(ushort *)&ln->buf->field_0x48 & 1),
                               (ulong)(*(ushort *)&ln->buf->field_0x48 >> 3 & 1),
                               (uint)(*(ushort *)&ln->buf->field_0x48 >> 4 & 1),ln->buf->start,
                               ln->buf->pos,ln->buf->last,ln->buf->file,ln->buf->file_pos,
                               ln->buf->file_last);
          }
          ngx_debug_point();
        }
        else {
          if ((((*(ushort *)&ln->buf->field_0x48 & 1) == 0) &&
              ((*(ushort *)&ln->buf->field_0x48 >> 1 & 1) == 0)) &&
             ((*(ushort *)&ln->buf->field_0x48 >> 2 & 1) == 0)) {
            local_a8 = ln->buf->file_last - ln->buf->file_pos;
          }
          else {
            local_a8 = (long)ln->buf->last - (long)ln->buf->pos;
          }
          cl = (ngx_chain_t *)((long)&cl->buf + local_a8);
        }
      }
      if ((cl == (ngx_chain_t *)0x0) && ((*(uint *)(lVar1 + 0xd8) & 0xff) == 0)) {
        data_local = (void *)0x0;
      }
      else {
        pnVar3 = (ngx_chain_t *)
                 (**(code **)(lVar1 + 0x38))(lVar1,*data,*(undefined8 *)((long)data + 0x20));
        if ((**(ulong **)(lVar1 + 0x50) & 0x10) != 0) {
          ngx_log_error_core(8,*(ngx_log_t **)(lVar1 + 0x50),0,"chain writer out: %p",pnVar3);
        }
        if (pnVar3 == (ngx_chain_t *)0xffffffffffffffff) {
          data_local = (void *)0xffffffffffffffff;
        }
        else {
          ln = *data;
          while (ln != (ngx_chain_t *)0x0 && ln != pnVar3) {
            pnVar2 = ln->next;
            ln->next = *(ngx_chain_t **)(*(long *)((long)data + 0x18) + 0x30);
            *(ngx_chain_t **)(*(long *)((long)data + 0x18) + 0x30) = ln;
            ln = pnVar2;
          }
          *(ngx_chain_t **)data = pnVar3;
          if ((*data == 0) &&
             (*(void **)((long)data + 8) = data, (*(uint *)(lVar1 + 0xd8) & 0xff) == 0)) {
            data_local = (void *)0x0;
          }
          else {
            data_local = (void *)0xfffffffffffffffe;
          }
        }
      }
      return (ngx_int_t)data_local;
    }
    if (((((ulong)ctx->out[4].next & 1) == 0) && ((*(ushort *)&ctx->out[4].next >> 1 & 1) == 0)) &&
       ((*(ushort *)&ctx->out[4].next >> 2 & 1) == 0)) {
      local_78 = (long)ctx->out[1].next - (long)ctx->out[1].buf;
    }
    else {
      local_78 = (long)ctx->out->next - (long)ctx->out->buf;
    }
    if ((local_78 == 0) &&
       (((((*(ushort *)&ctx->out[4].next >> 5 & 1) == 0 &&
          ((*(ushort *)&ctx->out[4].next >> 7 & 1) == 0)) &&
         ((*(ushort *)&ctx->out[4].next >> 6 & 1) == 0)) ||
        (((((ulong)ctx->out[4].next & 1) != 0 || ((*(ushort *)&ctx->out[4].next >> 1 & 1) != 0)) ||
         (((*(ushort *)&ctx->out[4].next >> 2 & 1) != 0 ||
          ((*(ushort *)&ctx->out[4].next >> 4 & 1) != 0)))))))) {
      if (1 < **(ulong **)(*(long *)((long)data + 0x18) + 0x48)) {
        ngx_log_error_core(2,*(ngx_log_t **)(*(long *)((long)data + 0x18) + 0x48),0,
                           "zero size buf in chain writer t:%d r:%d f:%d %p %p-%p %p %O-%O",
                           (ulong)(*(ushort *)&ctx->out[4].next & 1),
                           (ulong)(*(ushort *)&ctx->out[4].next >> 3 & 1),
                           (uint)(*(ushort *)&ctx->out[4].next >> 4 & 1),ctx->out[2].buf,
                           ctx->out->buf,ctx->out->next,ctx->out[3].next,ctx->out[1].buf,
                           ctx->out[1].next);
      }
      ngx_debug_point();
    }
    else {
      if (((((ulong)ctx->out[4].next & 1) == 0) && ((*(ushort *)&ctx->out[4].next >> 1 & 1) == 0))
         && ((*(ushort *)&ctx->out[4].next >> 2 & 1) == 0)) {
        local_80 = (long)ctx->out[1].next - (long)ctx->out[1].buf;
      }
      else {
        local_80 = (long)ctx->out->next - (long)ctx->out->buf;
      }
      cl = (ngx_chain_t *)((long)&cl->buf + local_80);
      if ((**(ulong **)(lVar1 + 0x50) & 0x10) != 0) {
        if (((((ulong)ctx->out[4].next & 1) == 0) && ((*(ushort *)&ctx->out[4].next >> 1 & 1) == 0))
           && ((*(ushort *)&ctx->out[4].next >> 2 & 1) == 0)) {
          local_98 = (long)ctx->out[1].next - (long)ctx->out[1].buf;
        }
        else {
          local_98 = (long)ctx->out->next - (long)ctx->out->buf;
        }
        ngx_log_error_core(8,*(ngx_log_t **)(lVar1 + 0x50),0,"chain writer buf fl:%d s:%uO",
                           (ulong)(*(ushort *)&ctx->out[4].next >> 5 & 1),local_98);
      }
      pnVar3 = ngx_alloc_chain_link(*(ngx_pool_t **)((long)data + 0x18));
      if (pnVar3 == (ngx_chain_t *)0x0) {
        return -1;
      }
      pnVar3->buf = (ngx_buf_t *)ctx->out;
      pnVar3->next = (ngx_chain_t *)0x0;
      **(undefined8 **)((long)data + 8) = pnVar3;
      *(ngx_chain_t ***)((long)data + 8) = &pnVar3->next;
    }
    ctx = (ngx_chain_writer_ctx_t *)ctx->last;
  } while( true );
}

Assistant:

ngx_int_t
ngx_chain_writer(void *data, ngx_chain_t *in)
{
    ngx_chain_writer_ctx_t *ctx = data;

    off_t              size;
    ngx_chain_t       *cl, *ln, *chain;
    ngx_connection_t  *c;

    c = ctx->connection;

    for (size = 0; in; in = in->next) {

#if 1
        if (ngx_buf_size(in->buf) == 0 && !ngx_buf_special(in->buf)) {

            ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, 0,
                          "zero size buf in chain writer "
                          "t:%d r:%d f:%d %p %p-%p %p %O-%O",
                          in->buf->temporary,
                          in->buf->recycled,
                          in->buf->in_file,
                          in->buf->start,
                          in->buf->pos,
                          in->buf->last,
                          in->buf->file,
                          in->buf->file_pos,
                          in->buf->file_last);

            ngx_debug_point();

            continue;
        }
#endif

        size += ngx_buf_size(in->buf);

        ngx_log_debug2(NGX_LOG_DEBUG_CORE, c->log, 0,
                       "chain writer buf fl:%d s:%uO",
                       in->buf->flush, ngx_buf_size(in->buf));

        cl = ngx_alloc_chain_link(ctx->pool);
        if (cl == NULL) {
            return NGX_ERROR;
        }

        cl->buf = in->buf;
        cl->next = NULL;
        *ctx->last = cl;
        ctx->last = &cl->next;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_CORE, c->log, 0,
                   "chain writer in: %p", ctx->out);

    for (cl = ctx->out; cl; cl = cl->next) {

#if 1
        if (ngx_buf_size(cl->buf) == 0 && !ngx_buf_special(cl->buf)) {

            ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, 0,
                          "zero size buf in chain writer "
                          "t:%d r:%d f:%d %p %p-%p %p %O-%O",
                          cl->buf->temporary,
                          cl->buf->recycled,
                          cl->buf->in_file,
                          cl->buf->start,
                          cl->buf->pos,
                          cl->buf->last,
                          cl->buf->file,
                          cl->buf->file_pos,
                          cl->buf->file_last);

            ngx_debug_point();

            continue;
        }
#endif

        size += ngx_buf_size(cl->buf);
    }

    if (size == 0 && !c->buffered) {
        return NGX_OK;
    }

    chain = c->send_chain(c, ctx->out, ctx->limit);

    ngx_log_debug1(NGX_LOG_DEBUG_CORE, c->log, 0,
                   "chain writer out: %p", chain);

    if (chain == NGX_CHAIN_ERROR) {
        return NGX_ERROR;
    }

    for (cl = ctx->out; cl && cl != chain; /* void */) {
        ln = cl;
        cl = cl->next;
        ngx_free_chain(ctx->pool, ln);
    }

    ctx->out = chain;

    if (ctx->out == NULL) {
        ctx->last = &ctx->out;

        if (!c->buffered) {
            return NGX_OK;
        }
    }

    return NGX_AGAIN;
}